

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O3

ENetProtocolCommand
enet_protocol_remove_sent_reliable_command
          (ENetPeer *peer,enet_uint16 reliableSequenceNumber,enet_uint8 channelID)

{
  ushort *puVar1;
  byte *pbVar2;
  ENetList *pEVar3;
  ENetChannel *pEVar4;
  ENetPacket *packet;
  bool bVar5;
  short sVar6;
  byte bVar7;
  _ENetListNode *p_Var8;
  
  pEVar3 = &peer->sentReliableCommands;
  for (p_Var8 = (peer->sentReliableCommands).sentinel.next; p_Var8 != &pEVar3->sentinel;
      p_Var8 = p_Var8->next) {
    if ((*(enet_uint16 *)&p_Var8[1].next == reliableSequenceNumber) &&
       (*(enet_uint8 *)((long)&p_Var8[2].previous + 1) == channelID)) {
      bVar5 = false;
      goto LAB_001074f7;
    }
  }
  p_Var8 = (peer->outgoingReliableCommands).sentinel.next;
  do {
    if ((p_Var8 == &(peer->outgoingReliableCommands).sentinel) ||
       (*(short *)((long)&p_Var8[2].next + 6) == 0)) {
      bVar7 = 0;
LAB_00107580:
      return (ENetProtocolCommand)bVar7;
    }
    if ((*(enet_uint16 *)&p_Var8[1].next == reliableSequenceNumber) &&
       (*(enet_uint8 *)((long)&p_Var8[2].previous + 1) == channelID)) {
      bVar5 = true;
LAB_001074f7:
      if ((ulong)channelID < peer->channelCount) {
        pEVar4 = peer->channels;
        sVar6 = *(short *)((long)pEVar4->reliableWindows +
                          (ulong)(reliableSequenceNumber >> 0xc) * 2 +
                          (ulong)((uint)channelID * 0x50));
        if ((sVar6 != 0) &&
           (sVar6 = sVar6 + -1,
           *(short *)((long)pEVar4->reliableWindows +
                     (ulong)(reliableSequenceNumber >> 0xc) * 2 + (ulong)((uint)channelID * 0x50)) =
                sVar6, sVar6 == 0)) {
          bVar7 = (byte)(reliableSequenceNumber >> 0xc);
          puVar1 = (ushort *)((long)pEVar4->reliableWindows + ((ulong)((uint)channelID * 0x50) - 2))
          ;
          *puVar1 = *puVar1 & (-2 << bVar7 | 0xfffeU >> 0x10 - bVar7);
        }
      }
      bVar7 = *(byte *)&p_Var8[2].previous;
      enet_list_remove(p_Var8);
      packet = (ENetPacket *)p_Var8[6].next;
      if (packet != (ENetPacket *)0x0) {
        if (!bVar5) {
          peer->reliableDataInTransit =
               peer->reliableDataInTransit - (uint)*(ushort *)((long)&p_Var8[2].next + 4);
        }
        packet->referenceCount = packet->referenceCount - 1;
        if (packet->referenceCount == 0) {
          pbVar2 = (byte *)((long)&packet->flags + 1);
          *pbVar2 = *pbVar2 | 1;
          enet_packet_destroy(packet);
        }
      }
      bVar7 = bVar7 & 0xf;
      enet_free(p_Var8);
      p_Var8 = (pEVar3->sentinel).next;
      if (p_Var8 != &pEVar3->sentinel) {
        peer->nextTimeout = *(int *)&p_Var8[1].previous + *(int *)((long)&p_Var8[1].next + 4);
      }
      goto LAB_00107580;
    }
    p_Var8 = p_Var8->next;
  } while( true );
}

Assistant:

static ENetProtocolCommand
enet_protocol_remove_sent_reliable_command (ENetPeer * peer, enet_uint16 reliableSequenceNumber, enet_uint8 channelID)
{
    ENetOutgoingCommand * outgoingCommand = NULL;
    ENetListIterator currentCommand;
    ENetProtocolCommand commandNumber;
    int wasSent = 1;

    for (currentCommand = enet_list_begin (& peer -> sentReliableCommands);
         currentCommand != enet_list_end (& peer -> sentReliableCommands);
         currentCommand = enet_list_next (currentCommand))
    {
       outgoingCommand = (ENetOutgoingCommand *) currentCommand;
        
       if (outgoingCommand -> reliableSequenceNumber == reliableSequenceNumber &&
           outgoingCommand -> command.header.channelID == channelID)
         break;
    }

    if (currentCommand == enet_list_end (& peer -> sentReliableCommands))
    {
       for (currentCommand = enet_list_begin (& peer -> outgoingReliableCommands);
            currentCommand != enet_list_end (& peer -> outgoingReliableCommands);
            currentCommand = enet_list_next (currentCommand))
       {
          outgoingCommand = (ENetOutgoingCommand *) currentCommand;

          if (outgoingCommand -> sendAttempts < 1) return ENET_PROTOCOL_COMMAND_NONE;

          if (outgoingCommand -> reliableSequenceNumber == reliableSequenceNumber &&
              outgoingCommand -> command.header.channelID == channelID)
            break;
       }

       if (currentCommand == enet_list_end (& peer -> outgoingReliableCommands))
         return ENET_PROTOCOL_COMMAND_NONE;

       wasSent = 0;
    }

    if (outgoingCommand == NULL)
      return ENET_PROTOCOL_COMMAND_NONE;

    if (channelID < peer -> channelCount)
    {
       ENetChannel * channel = & peer -> channels [channelID];
       enet_uint16 reliableWindow = reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
       if (channel -> reliableWindows [reliableWindow] > 0)
       {
          -- channel -> reliableWindows [reliableWindow];
          if (! channel -> reliableWindows [reliableWindow])
            channel -> usedReliableWindows &= ~ (1 << reliableWindow);
       }
    }

    commandNumber = (ENetProtocolCommand) (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_MASK);
    
    enet_list_remove (& outgoingCommand -> outgoingCommandList);

    if (outgoingCommand -> packet != NULL)
    {
       if (wasSent)
         peer -> reliableDataInTransit -= outgoingCommand -> fragmentLength;

       -- outgoingCommand -> packet -> referenceCount;

       if (outgoingCommand -> packet -> referenceCount == 0)
       {
          outgoingCommand -> packet -> flags |= ENET_PACKET_FLAG_SENT;

          enet_packet_destroy (outgoingCommand -> packet);
       }
    }

    enet_free (outgoingCommand);

    if (enet_list_empty (& peer -> sentReliableCommands))
      return commandNumber;
    
    outgoingCommand = (ENetOutgoingCommand *) enet_list_front (& peer -> sentReliableCommands);
    
    peer -> nextTimeout = outgoingCommand -> sentTime + outgoingCommand -> roundTripTimeout;

    return commandNumber;
}